

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

PIPELINE_RESOURCE_FLAGS __thiscall
Diligent::PipelineStateGLImpl::GetSamplerResourceFlag
          (PipelineStateGLImpl *this,TShaderStages *Stages,bool SilenceWarning)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  ShaderGLImpl **Stage;
  char *pcVar2;
  char *Args_1;
  byte bVar3;
  char (*in_R8) [205];
  PIPELINE_RESOURCE_FLAGS PVar4;
  char (*pacVar5) [205];
  char (*pacVar6) [205];
  string msg;
  
  pcVar2 = (char *)(Stages->
                   super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  Args_1 = (char *)(Stages->
                   super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar2 == Args_1) {
    FormatString<char[26],char[16]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!Stages.empty()",
               (char (*) [16])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetSamplerResourceFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)&msg);
    pcVar2 = (char *)(Stages->
                     super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
    Args_1 = (char *)(Stages->
                     super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar3 = 0;
  pacVar5 = (char (*) [205])0xff;
  for (; PVar4 = (PIPELINE_RESOURCE_FLAGS)pacVar5, pcVar2 != Args_1; pcVar2 = pcVar2 + 8) {
    PVar1 = (*(int *)(*(long *)pcVar2 + 0x6c) != 1) * '\x02';
    pacVar6 = (char (*) [205])(ulong)PVar1;
    if (PVar4 != ~PIPELINE_RESOURCE_FLAG_NONE) {
      pacVar6 = pacVar5;
    }
    bVar3 = bVar3 | (PVar4 != ~PIPELINE_RESOURCE_FLAG_NONE && PVar4 != PVar1);
    in_R8 = pacVar5;
    pacVar5 = pacVar6;
  }
  if (((~bVar3 | SilenceWarning) & 1) == 0) {
    FormatString<char[17],char_const*,char[205]>
              (&msg,(Diligent *)"Pipeline state \'",
               (char (*) [17])
               &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)
                        "\' uses shaders compiled from different source languages. When separable programs are not available, this may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures."
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return PVar4;
}

Assistant:

PIPELINE_RESOURCE_FLAGS PipelineStateGLImpl::GetSamplerResourceFlag(const TShaderStages& Stages, bool SilenceWarning) const
{
    VERIFY_EXPR(!Stages.empty());

    constexpr auto UndefinedFlag = static_cast<PIPELINE_RESOURCE_FLAGS>(0xFF);

    auto SamplerResourceFlag = UndefinedFlag;
    bool ConflictsFound      = false;
    for (auto& Stage : Stages)
    {
        auto Lang = Stage->GetSourceLanguage();
        auto Flag = Lang == SHADER_SOURCE_LANGUAGE_HLSL ?
            PIPELINE_RESOURCE_FLAG_NONE :
            PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;

        if (SamplerResourceFlag == UndefinedFlag)
            SamplerResourceFlag = Flag;
        else if (SamplerResourceFlag != Flag)
            ConflictsFound = true;
    }

    if (ConflictsFound && !SilenceWarning)
    {
        LOG_WARNING_MESSAGE("Pipeline state '", m_Desc.Name,
                            "' uses shaders compiled from different source languages. When separable programs are not available, this "
                            "may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures.");
    }

    return SamplerResourceFlag;
}